

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_graph.c
# Opt level: O2

void graph_vis(t_gobj *gr,_glist *parent_glist,int vis)

{
  float fVar1;
  float fVar2;
  float fVar3;
  t_pd p_Var4;
  _gobj *p_Var5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  _rtext *p_Var10;
  ulong uVar11;
  _glist *p_Var12;
  _glist *x;
  char *anchor;
  char *anchor_00;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  _glist *p_Var16;
  t_gobj *ptVar17;
  long lVar18;
  int y1_00;
  bool bVar19;
  t_float tVar20;
  t_float tVar21;
  float fVar22;
  t_float tVar23;
  double dVar24;
  float fVar25;
  float fVar26;
  char **ppcVar27;
  int local_104;
  int y2;
  char *tags2 [2];
  int x2;
  int y1;
  int x1;
  _glist *local_a0;
  t_gobj *local_98;
  t_symbol *arrayname;
  char *tags3 [3];
  char tag [50];
  
  tags2[0] = tag;
  tags2[1] = "graph";
  if (((ulong)gr[0xe].g_next & 0x100) == 0) {
    text_vis(gr,parent_glist,vis);
  }
  else if (vis == 0) {
    graph_getrect(gr,parent_glist,&x1,&y1,&x2,&y2);
    p_Var10 = glist_findrtext(parent_glist,(t_text *)gr);
    rtext_erase(p_Var10);
    sprintf(tag,"graph%lx",gr);
    glist_eraseiofor(parent_glist,(t_object *)gr,tag);
    p_Var5 = gr[0xe].g_next;
    p_Var12 = glist_getcanvas(x);
    pdgui_vmess((char *)0x0,"crs",p_Var12,"delete",tag);
    if (((ulong)p_Var5 & 1) == 0) {
      ptVar17 = gr + 3;
      while (p_Var4 = ptVar17->g_pd, p_Var4 != (t_pd)0x0) {
        gobj_vis((t_gobj *)p_Var4,(_glist *)gr,0);
        ptVar17 = (t_gobj *)&p_Var4->c_helpname;
      }
    }
  }
  else {
    iVar6 = canvas_showtext((_glist *)gr);
    if (iVar6 != 0) {
      p_Var10 = glist_findrtext(parent_glist,(t_text *)gr);
      rtext_draw(p_Var10);
    }
    graph_getrect(gr,parent_glist,&x1,&y1,&x2,&y2);
    sprintf(tag,"graph%lx",gr);
    uVar15 = (ulong)(uint)x1;
    uVar13 = (ulong)(uint)y1;
    p_Var16 = (_glist *)(ulong)(uint)x2;
    uVar11 = (ulong)(uint)y2;
    p_Var12 = p_Var16;
    glist_drawiofor(parent_glist,(t_object *)gr,1,tag,x1,y1,x2,y2);
    if (((ulong)gr[0xe].g_next & 1) == 0) {
      fVar22 = *(float *)&gr[0xb].g_next;
      fVar26 = *(float *)&gr[5].g_next;
      fVar25 = *(float *)((long)&gr[5].g_next + 4);
      fVar1 = *(float *)&gr[6].g_pd;
      fVar2 = *(float *)&gr[9].g_next;
      fVar3 = *(float *)((long)&gr[6].g_pd + 4);
      iVar6 = glist_getfont((_glist *)gr);
      iVar7 = glist_getzoom((_glist *)gr);
      iVar7 = sys_hostfontsize(iVar6,iVar7);
      tags3[0] = tag;
      tags3[1] = "label";
      tags3[2] = "graph";
      p_Var12 = glist_getcanvas((_glist *)"graph");
      uVar8 = glist_getzoom((_glist *)gr);
      local_a0 = p_Var16;
      pdgui_vmess((char *)0x0,"crr iiiiiiiiii ri rr rS",p_Var12,"create","line",uVar15,uVar13,uVar15
                  ,uVar11,p_Var16,uVar11,p_Var16,uVar13,uVar15,uVar13,"-width",(ulong)uVar8,
                  "-capstyle","projecting","-tags",2,tags2);
      iVar6 = y2;
      if (y1 < y2) {
        iVar6 = y1;
      }
      local_104 = iVar6 + -1;
      iVar7 = -iVar7;
      iVar14 = 1;
      ptVar17 = gr + 3;
      local_98 = ptVar17;
      while (p_Var4 = ptVar17->g_pd, p_Var4 != (t_pd)0x0) {
        if ((((t_gobj *)&p_Var4->c_name)->g_pd == garray_class) &&
           (iVar9 = garray_getname((_garray *)p_Var4,&arrayname), iVar9 == 0)) {
          ppcVar27 = (char **)0x144991;
          iVar9 = glist_fontheight((_glist *)gr);
          local_104 = local_104 - iVar9;
          _graph_create_text((_glist *)gr,x1,local_104,arrayname->s_name,"nw",iVar7,(int)tags3,
                             ppcVar27);
        }
        ptVar17 = (t_gobj *)&p_Var4->c_helpname;
      }
      anchor = "e";
      if ((fVar26 + fVar1) * 0.5 < fVar22) {
        anchor = "w";
      }
      anchor_00 = "n";
      if ((fVar25 + fVar3) * 0.5 < fVar2) {
        anchor_00 = "s";
      }
      if (*(int *)&gr[8].g_next != 0) {
        if (y1 < y2) {
          y1 = y2;
        }
        fVar22 = *(float *)&gr[8].g_pd;
        iVar9 = (int)(float)y1;
        y1_00 = (int)(float)iVar6;
        iVar6 = 0;
        while( true ) {
          fVar26 = *(float *)&gr[5].g_next;
          fVar25 = *(float *)&gr[6].g_pd;
          if (fVar25 * 0.99 + fVar26 * 0.01 <= fVar22) break;
          bVar19 = iVar6 % *(int *)&gr[8].g_next == 0;
          tVar20 = glist_xtopixels((_glist *)gr,fVar22);
          tVar21 = glist_xtopixels((_glist *)gr,fVar22);
          _graph_create_line4((_glist *)gr,(int)tVar20,iVar9,(int)tVar21,
                              iVar9 - ((uint)bVar19 * 2 + 2),tags2);
          tVar20 = glist_xtopixels((_glist *)gr,fVar22);
          tVar21 = glist_xtopixels((_glist *)gr,fVar22);
          _graph_create_line4((_glist *)gr,(int)tVar20,y1_00,(int)tVar21,
                              y1_00 + (uint)bVar19 * 2 + 2,tags2);
          iVar6 = iVar6 + 1;
          fVar22 = fVar22 + *(float *)((long)&gr[8].g_pd + 4);
        }
        fVar22 = *(float *)&gr[8].g_pd - *(float *)((long)&gr[8].g_pd + 4);
        while (fVar26 * 0.99 + fVar25 * 0.01 < fVar22) {
          bVar19 = iVar14 % *(int *)&gr[8].g_next == 0;
          tVar20 = glist_xtopixels((_glist *)gr,fVar22);
          tVar21 = glist_xtopixels((_glist *)gr,fVar22);
          _graph_create_line4((_glist *)gr,(int)tVar20,iVar9,(int)tVar21,
                              iVar9 - ((uint)bVar19 * 2 + 2),tags2);
          tVar20 = glist_xtopixels((_glist *)gr,fVar22);
          tVar21 = glist_xtopixels((_glist *)gr,fVar22);
          _graph_create_line4((_glist *)gr,(int)tVar20,y1_00,(int)tVar21,
                              y1_00 + (uint)bVar19 * 2 + 2,tags2);
          iVar14 = iVar14 + 1;
          fVar22 = fVar22 - *(float *)((long)&gr[8].g_pd + 4);
          fVar25 = *(float *)&gr[6].g_pd;
          fVar26 = *(float *)&gr[5].g_next;
        }
      }
      if (*(int *)((long)&gr[10].g_pd + 4) != 0) {
        fVar22 = *(float *)((long)&gr[5].g_next + 4);
        fVar26 = *(float *)((long)&gr[6].g_pd + 4);
        fVar25 = fVar26;
        if (fVar22 <= fVar26) {
          fVar25 = fVar22;
          fVar22 = fVar26;
        }
        iVar6 = 0;
        for (tVar20 = *(t_float *)((long)&gr[9].g_next + 4); tVar20 < fVar22 * 0.99 + fVar25 * 0.01;
            tVar20 = tVar20 + *(float *)&gr[10].g_pd) {
          bVar19 = iVar6 % *(int *)((long)&gr[10].g_pd + 4) == 0;
          tVar21 = glist_ytopixels((_glist *)gr,tVar20);
          tVar23 = glist_ytopixels((_glist *)gr,tVar20);
          _graph_create_line4((_glist *)gr,x1,(int)tVar21,x1 + (uint)bVar19 * 2 + 2,(int)tVar23,
                              tags2);
          tVar21 = glist_ytopixels((_glist *)gr,tVar20);
          iVar14 = (int)local_a0;
          tVar23 = glist_ytopixels((_glist *)gr,tVar20);
          _graph_create_line4((_glist *)gr,iVar14,(int)tVar21,iVar14 - ((uint)bVar19 * 2 + 2),
                              (int)tVar23,tags2);
          iVar6 = iVar6 + 1;
        }
        iVar6 = 1;
        for (tVar20 = *(float *)((long)&gr[9].g_next + 4) - *(float *)&gr[10].g_pd;
            fVar25 * 0.99 + fVar22 * 0.01 < tVar20; tVar20 = tVar20 - *(float *)&gr[10].g_pd) {
          bVar19 = iVar6 % *(int *)((long)&gr[10].g_pd + 4) == 0;
          tVar21 = glist_ytopixels((_glist *)gr,tVar20);
          tVar23 = glist_ytopixels((_glist *)gr,tVar20);
          _graph_create_line4((_glist *)gr,x1,(int)tVar21,x1 + (uint)bVar19 * 2 + 2,(int)tVar23,
                              tags2);
          tVar21 = glist_ytopixels((_glist *)gr,tVar20);
          iVar14 = (int)local_a0;
          tVar23 = glist_ytopixels((_glist *)gr,tVar20);
          _graph_create_line4((_glist *)gr,iVar14,(int)tVar21,iVar14 - ((uint)bVar19 * 2 + 2),
                              (int)tVar23,tags2);
          iVar6 = iVar6 + 1;
        }
      }
      ptVar17 = local_98;
      for (lVar18 = 0; lVar18 < *(int *)((long)&gr[8].g_next + 4); lVar18 = lVar18 + 1) {
        dVar24 = atof((&(gr[9].g_pd)->c_name)[lVar18]->s_name);
        tVar20 = glist_xtopixels((_glist *)gr,(float)dVar24);
        ppcVar27 = (char **)0x145040;
        tVar21 = glist_ytopixels((_glist *)gr,*(t_float *)&gr[9].g_next);
        _graph_create_text((_glist *)gr,(int)tVar20,(int)tVar21,
                           (&(gr[9].g_pd)->c_name)[lVar18]->s_name,anchor_00,iVar7,(int)tags3,
                           ppcVar27);
      }
      for (lVar18 = 0; lVar18 < *(int *)&gr[10].g_next; lVar18 = lVar18 + 1) {
        tVar20 = glist_xtopixels((_glist *)gr,*(t_float *)&gr[0xb].g_next);
        dVar24 = atof((&(gr[0xb].g_pd)->c_name)[lVar18]->s_name);
        ppcVar27 = (char **)0x1450b3;
        tVar21 = glist_ytopixels((_glist *)gr,(float)dVar24);
        _graph_create_text((_glist *)gr,(int)tVar20,(int)tVar21,
                           (&(gr[0xb].g_pd)->c_name)[lVar18]->s_name,anchor,iVar7,(int)tags3,
                           ppcVar27);
      }
      while (p_Var4 = ptVar17->g_pd, p_Var4 != (t_pd)0x0) {
        gobj_vis((t_gobj *)p_Var4,(_glist *)gr,1);
        ptVar17 = (t_gobj *)&p_Var4->c_helpname;
      }
    }
    else {
      p_Var12 = glist_getcanvas(p_Var12);
      uVar8 = glist_getzoom((_glist *)gr);
      pdgui_vmess((char *)0x0,"crr iiiiiiiiii ri rr rr rS",p_Var12,"create","polygon",
                  (ulong)(uint)x1,uVar13,uVar15,uVar11,p_Var16,uVar11,p_Var16,uVar13,uVar15,uVar13,
                  "-width",(ulong)uVar8,"-fill","#c0c0c0","-joinstyle","miter","-tags",2,tags2);
    }
  }
  return;
}

Assistant:

static void graph_vis(t_gobj *gr, t_glist *parent_glist, int vis)
{
    t_glist *x = (t_glist *)gr;
    char tag[50];
    const char *tags2[] = {tag, "graph" };
    t_gobj *g;
    int x1, y1, x2, y2;
        /* ordinary subpatches: just act like a text object */
    if (!x->gl_isgraph)
    {
        text_widgetbehavior.w_visfn(gr, parent_glist, vis);
        return;
    }

    if (vis && canvas_showtext(x))
        rtext_draw(glist_findrtext(parent_glist, &x->gl_obj));
    graph_getrect(gr, parent_glist, &x1, &y1, &x2, &y2);
    if (!vis)
        rtext_erase(glist_findrtext(parent_glist, &x->gl_obj));

    sprintf(tag, "graph%lx", (t_int)x);
    if (vis)
        glist_drawiofor(parent_glist, &x->gl_obj, 1,
            tag, x1, y1, x2, y2);
    else glist_eraseiofor(parent_glist, &x->gl_obj, tag);
        /* if we look like a graph but have been moved to a toplevel,
        just show the bounding rectangle */
    if (x->gl_havewindow)
    {
        if (vis)
            pdgui_vmess(0, "crr iiiiiiiiii ri rr rr rS",
                glist_getcanvas(x->gl_owner), "create", "polygon",
                x1,y1, x1,y2, x2,y2, x2,y1, x1,y1,
                "-width", glist_getzoom(x),
                "-fill", "#c0c0c0",
                "-joinstyle", "miter",
                "-tags", 2, tags2);
        else
            pdgui_vmess(0, "crs",
                glist_getcanvas(x->gl_owner), "delete", tag);
        return;
    }
        /* otherwise draw (or erase) us as a graph inside another glist. */
    if (vis)
    {
        int i;
        t_float f;
        t_gobj *g;
        t_symbol *arrayname;
        char *ylabelanchor =
            (x->gl_ylabelx > 0.5*(x->gl_x1 + x->gl_x2) ? "w" : "e");
        char *xlabelanchor =
            (x->gl_xlabely > 0.5*(x->gl_y1 + x->gl_y2) ? "s" : "n");
        int fs = sys_hostfontsize(glist_getfont(x), glist_getzoom(x));
        const char *tags3[] = {tag, "label", "graph" };

            /* draw a rectangle around the graph */
        pdgui_vmess(0, "crr iiiiiiiiii ri rr rS",
                  glist_getcanvas(x->gl_owner),
                  "create", "line",
                  x1,y1, x1,y2, x2,y2, x2,y1, x1,y1,
                  "-width", glist_getzoom(x),
                  "-capstyle", "projecting",
                  "-tags", 2, tags2);
            /* if there's just one "garray" in the graph, write its name
                along the top */
        for (i = (y1 < y2 ? y1 : y2)-1, g = x->gl_list; g; g = g->g_next)
            if (g->g_pd == garray_class &&
                !garray_getname((t_garray *)g, &arrayname))
        {
            i -= glist_fontheight(x);
            _graph_create_text(x,
                x1, i,
                arrayname->s_name,
                "nw", -fs,
                3, tags3);
        }

            /* draw ticks on horizontal borders.  If lperb field is
            zero, this is disabled. */
        if (x->gl_xtick.k_lperb)
        {
            t_float upix, lpix;
            if (y2 < y1)
                upix = y1, lpix = y2;
            else upix = y2, lpix = y1;
            for (i = 0, f = x->gl_xtick.k_point;
                f < 0.99 * x->gl_x2 + 0.01*x->gl_x1; i++,
                    f += x->gl_xtick.k_inc)
            {
                int tickpix = (i % x->gl_xtick.k_lperb ? 2 : 4);
                _graph_create_line4(x,
                    (int)glist_xtopixels(x, f), (int)upix,
                    (int)glist_xtopixels(x, f), (int)upix - tickpix,
                    tags2);
                _graph_create_line4(x,
                    (int)glist_xtopixels(x, f), (int)lpix,
                    (int)glist_xtopixels(x, f), (int)lpix + tickpix,
                    tags2);
            }
            for (i = 1, f = x->gl_xtick.k_point - x->gl_xtick.k_inc;
                f > 0.99 * x->gl_x1 + 0.01*x->gl_x2;
                    i++, f -= x->gl_xtick.k_inc)
            {
                int tickpix = (i % x->gl_xtick.k_lperb ? 2 : 4);
                _graph_create_line4(x,
                    (int)glist_xtopixels(x, f), (int)upix,
                    (int)glist_xtopixels(x, f), (int)upix - tickpix,
                    tags2);
                _graph_create_line4(x,
                    (int)glist_xtopixels(x, f), (int)lpix,
                    (int)glist_xtopixels(x, f), (int)lpix + tickpix,
                    tags2);
            }
        }

            /* draw ticks in vertical borders*/
        if (x->gl_ytick.k_lperb)
        {
            t_float ubound, lbound;
            if (x->gl_y2 < x->gl_y1)
                ubound = x->gl_y1, lbound = x->gl_y2;
            else ubound = x->gl_y2, lbound = x->gl_y1;
            for (i = 0, f = x->gl_ytick.k_point;
                f < 0.99 * ubound + 0.01 * lbound;
                    i++, f += x->gl_ytick.k_inc)
            {
                int tickpix = (i % x->gl_ytick.k_lperb ? 2 : 4);
                _graph_create_line4(x,
                    x1, (int)glist_ytopixels(x, f),
                    x1 + tickpix, (int)glist_ytopixels(x, f),
                    tags2);
                _graph_create_line4(x,
                    x2, (int)glist_ytopixels(x, f),
                    x2 - tickpix, (int)glist_ytopixels(x, f),
                    tags2);
            }
            for (i = 1, f = x->gl_ytick.k_point - x->gl_ytick.k_inc;
                f > 0.99 * lbound + 0.01 * ubound;
                    i++, f -= x->gl_ytick.k_inc)
            {
                int tickpix = (i % x->gl_ytick.k_lperb ? 2 : 4);
                _graph_create_line4(x,
                    x1, (int)glist_ytopixels(x, f),
                    x1 + tickpix, (int)glist_ytopixels(x, f),
                    tags2);
                _graph_create_line4(x,
                    x2, (int)glist_ytopixels(x, f),
                    x2 - tickpix, (int)glist_ytopixels(x, f),
                    tags2);
            }
        }
            /* draw x labels */
        for (i = 0; i < x->gl_nxlabels; i++)
            _graph_create_text(x,
                (int)glist_xtopixels(x, atof(x->gl_xlabel[i]->s_name)),
                (int)glist_ytopixels(x, x->gl_xlabely),
                x->gl_xlabel[i]->s_name,
                xlabelanchor, -fs,
                3, tags3);
            /* draw y labels */
        for (i = 0; i < x->gl_nylabels; i++)
            _graph_create_text(x,
                (int)glist_xtopixels(x, x->gl_ylabelx),
                (int)glist_ytopixels(x, atof(x->gl_ylabel[i]->s_name)),
                x->gl_ylabel[i]->s_name,
                ylabelanchor, -fs,
                3, tags3);

            /* draw contents of graph as glist */
        for (g = x->gl_list; g; g = g->g_next)
            gobj_vis(g, x, 1);
    }
    else
    {
        pdgui_vmess(0, "crs", glist_getcanvas(x->gl_owner), "delete", tag);
        for (g = x->gl_list; g; g = g->g_next)
            gobj_vis(g, x, 0);
    }
}